

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O1

int Sim_UtilInfoIsImp(uint *pPats1,uint *pPats2,int nSimWords)

{
  ulong uVar1;
  
  if (0 < nSimWords) {
    uVar1 = 0;
    do {
      if ((pPats1[uVar1] & ~pPats2[uVar1]) != 0) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nSimWords != uVar1);
  }
  return 1;
}

Assistant:

int Sim_UtilInfoIsImp( unsigned * pPats1, unsigned * pPats2, int nSimWords )
{
    int k;
    for ( k = 0; k < nSimWords; k++ )
        if ( pPats1[k] & ~pPats2[k] )
            return 0;
    return 1;
}